

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateInterfaceMembers
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  long lVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  
  pFVar3 = this->descriptor_;
  if (((~(byte)pFVar3[1] & 0x60) != 0) &&
     ((((pDVar2 = FieldDescriptor::message_type(pFVar3), pDVar2 != (Descriptor *)0x0 ||
        (((byte)pFVar3[1] & 2) != 0)) || (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) == '\x02')) ||
      ((lVar1 = *(long *)(pFVar3 + 0x28), lVar1 != 0 && ((byte)pFVar3[1] & 0x10) != 0 &&
       ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))))))) {
    WriteFieldAccessorDocComment(printer,this->descriptor_,HAZZER,false);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
  }
  pFVar3 = this->descriptor_;
  if (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) == '\x03') {
    WriteFieldEnumValueAccessorDocComment(printer,pFVar3,GETTER,false);
    io::Printer::Print(printer,&this->variables_,"$deprecation$int get$capitalized_name$Value();\n")
    ;
    pFVar3 = this->descriptor_;
  }
  WriteFieldAccessorDocComment(printer,pFVar3,GETTER,false);
  io::Printer::Print(printer,&this->variables_,"$deprecation$$type$ get$capitalized_name$();\n");
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(variables_,
                   "$deprecation$boolean has$capitalized_name$();\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER);
    printer->Print(variables_,
                   "$deprecation$int get$capitalized_name$Value();\n");
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_, "$deprecation$$type$ get$capitalized_name$();\n");
}